

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RatioSequence.cpp
# Opt level: O3

void __thiscall RatioSequence::RatioSequence(RatioSequence *this,string *ptA,string *ptB)

{
  pointer pdVar1;
  invalid_argument *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long lVar5;
  size_type __n;
  vector<double,_std::allocator<double>_> dblvecB;
  vector<double,_std::allocator<double>_> dblvecA;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strvecA;
  vector<double,_std::allocator<double>_> local_180;
  vector<double,_std::allocator<double>_> local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Ratio local_70;
  
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->combineCode = 0;
  (this->_RatioSequence).super__Vector_base<Ratio,_std::allocator<Ratio>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Tools::string_split(&local_108,ptA,", ","(,)");
  Tools::string_split(&local_120,ptB,", ","(,)");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_138,&local_108);
  Tools::stringvec_to_doublevec(&local_168,&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_150,&local_120);
  Tools::stringvec_to_doublevec(&local_180,&local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_150);
  pdVar1 = local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
    __n = (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
    std::vector<Ratio,_std::allocator<Ratio>_>::reserve(&this->_RatioSequence,__n);
    if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar1) {
      lVar5 = 0;
      do {
        Ratio::Ratio(&local_70,
                     local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5],
                     local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar5]);
        std::vector<Ratio,_std::allocator<Ratio>_>::emplace_back<Ratio>
                  (&this->_RatioSequence,&local_70);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.fEdges);
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_70.eEdges);
        lVar5 = lVar5 + 1;
      } while (__n + (__n == 0) != lVar5);
    }
    if (local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_120);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_b0,"Coordinates have different numbers of dimensions: (",ptA);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar3) {
    local_f0.field_2._M_allocated_capacity = *psVar3;
    local_f0.field_2._8_8_ = plVar2[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar3;
  }
  local_f0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_90,&local_f0,ptB);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_d0 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_d0 == plVar4) {
    local_c0 = *plVar4;
    lStack_b8 = plVar2[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar4;
  }
  local_c8 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::invalid_argument::invalid_argument(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

RatioSequence::RatioSequence(string ptA, string ptB) {
    auto strvecA = Tools::string_split(ptA, ", ", "(,)");
    auto strvecB = Tools::string_split(ptB, ", ", "(,)");
    auto dblvecA = Tools::stringvec_to_doublevec(strvecA);
    auto dblvecB = Tools::stringvec_to_doublevec(strvecB);
    if (dblvecA.size() != dblvecB.size())
        throw std::invalid_argument("Coordinates have different numbers of dimensions: (" + ptA + "),(" + ptB + ")");
    size_t len = dblvecA.size();
    _RatioSequence.reserve(len);
    for (size_t i=0; i < len; ++i) {
        this->push_back_value(Ratio(dblvecA[i], dblvecB[i]));
    }
}